

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<short> min,WrappedType<short> max,float gridSize)

{
  deUint32 dVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  int iVar5;
  ushort uVar6;
  int iVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ushort uVar13;
  short sVar14;
  short sVar15;
  int iVar16;
  ushort uVar17;
  short sVar18;
  WrappedType<short> WVar19;
  short sVar20;
  uint uVar21;
  float fVar22;
  deRandom rnd;
  uint local_9c;
  ulong local_98;
  deRandom local_80;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  local_68 = (ulong)(uint)(componentCount * 2);
  if (stride != 0) {
    local_68 = (ulong)(uint)stride;
  }
  local_38 = (ulong)(uint)((int)local_68 * 2);
  iVar5 = (int)local_68 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar5 * count + offset));
  deRandom_init(&local_80,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar22 = (float)(int)max.m_value - (float)(int)min.m_value;
    uVar21 = -(uint)(-fVar22 <= fVar22);
    uVar13 = (ushort)(int)((float)(~uVar21 & (uint)-fVar22 | (uint)fVar22 & uVar21) * gridSize);
    uVar6 = 0x400;
    if (0x400 < (short)uVar13) {
      uVar6 = uVar13;
    }
    if (0 < count) {
      local_40 = local_70 + offset;
      uVar21 = (int)max.m_value - (int)min.m_value;
      iVar7 = (int)(short)uVar6;
      iVar11 = (int)local_68;
      local_48 = (ulong)(uint)(iVar11 * 3);
      local_50 = (ulong)(uint)(iVar11 * 4);
      local_58 = (ulong)(uint)(iVar11 * 5);
      local_60 = (ulong)(uint)count;
      iVar11 = 4;
      iVar12 = 6;
      local_98 = 0;
      do {
        local_9c = 0;
        while( true ) {
          uVar9 = (uint)(ushort)min.m_value;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_80);
            uVar9 = dVar1 % uVar21 + (uint)(ushort)min.m_value;
          }
          iVar10 = uVar9 - (int)(short)uVar9 % iVar7;
          uVar9 = (uint)(ushort)max.m_value - iVar10 & 0x7fff;
          uVar13 = uVar6;
          if (uVar6 < (ushort)uVar9) {
            dVar1 = deRandom_getUint32(&local_80);
            uVar13 = (short)(dVar1 % (uVar9 - iVar7)) + uVar6;
          }
          uVar9 = (uint)(ushort)min.m_value;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_80);
            uVar9 = dVar1 % uVar21 + (uint)(ushort)min.m_value;
          }
          iVar16 = uVar9 - (int)(short)uVar9 % iVar7;
          uVar9 = (uint)(ushort)max.m_value - iVar16 & 0x7fff;
          uVar17 = uVar6;
          if (uVar6 < (ushort)uVar9) {
            dVar1 = deRandom_getUint32(&local_80);
            uVar17 = (short)(dVar1 % (uVar9 - iVar7)) + uVar6;
          }
          if (componentCount < 3) {
            sVar20 = 0;
          }
          else {
            WVar19.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar1 = deRandom_getUint32(&local_80);
              WVar19.m_value = (short)(dVar1 % uVar21) + min.m_value;
            }
            sVar20 = WVar19.m_value - WVar19.m_value % (short)uVar6;
          }
          sVar4 = 1;
          if (3 < componentCount) {
            WVar19.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar1 = deRandom_getUint32(&local_80);
              WVar19.m_value = (short)(dVar1 % uVar21) + min.m_value;
            }
            sVar4 = WVar19.m_value - WVar19.m_value % (short)uVar6;
          }
          sVar14 = uVar13 - (short)uVar13 % (short)uVar6;
          sVar18 = uVar17 - (short)uVar17 % (short)uVar6;
          if ((componentCount < 3) ||
             (((fVar22 = (float)(int)sVar20 + (float)(int)sVar14, uVar9 = -(uint)(-fVar22 <= fVar22)
               , (float)iVar7 <= (float)(~uVar9 & (uint)-fVar22 | (uint)fVar22 & uVar9) &&
               (fVar22 = (float)(int)sVar4 + (float)(int)sVar18, uVar9 = -(uint)(-fVar22 <= fVar22),
               (float)iVar7 <= (float)(~uVar9 & (uint)-fVar22 | (uint)fVar22 & uVar9))) ||
              (2 < local_9c)))) break;
          local_9c = local_9c + 1;
        }
        iVar2 = iVar5 * (int)local_98;
        sVar8 = (short)iVar10;
        *(short *)(local_40 + iVar2) = sVar8;
        sVar15 = (short)iVar16;
        *(short *)(local_40 + (iVar2 + 2)) = sVar15;
        iVar10 = (int)local_68;
        sVar14 = sVar14 + sVar8;
        *(short *)(local_40 + (iVar2 + iVar10)) = sVar14;
        *(short *)(local_40 + (iVar2 + iVar10 + 2)) = sVar15;
        sVar18 = sVar18 + sVar15;
        *(short *)(local_40 + (iVar2 + (int)local_38)) = sVar8;
        *(short *)(local_40 + (iVar2 + (int)local_38 + 2)) = sVar18;
        *(short *)(local_40 + (iVar2 + (int)local_48)) = sVar8;
        *(short *)(local_40 + (iVar2 + 2 + (int)local_48)) = sVar18;
        *(short *)(local_40 + (iVar2 + (int)local_50)) = sVar14;
        *(short *)(local_40 + (iVar2 + 2 + (int)local_50)) = sVar15;
        *(short *)(local_40 + (iVar2 + (int)local_58)) = sVar14;
        *(short *)(local_40 + (iVar2 + 2 + (int)local_58)) = sVar18;
        if (2 < componentCount) {
          lVar3 = 6;
          iVar16 = iVar11;
          do {
            *(short *)(local_40 + iVar16) = sVar20;
            iVar16 = iVar16 + iVar10;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        if (3 < componentCount) {
          lVar3 = 6;
          iVar16 = iVar12;
          do {
            *(short *)(local_40 + iVar16) = sVar4;
            iVar16 = iVar16 + iVar10;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        local_98 = local_98 + 1;
        iVar11 = iVar11 + iVar5;
        iVar12 = iVar12 + iVar5;
      } while (local_98 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}